

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O2

void __thiscall Sexp::DumpAtom(Sexp *this,ostream *stream)

{
  int line;
  string *psVar1;
  ostream *poVar2;
  char *pcVar3;
  
  switch(this->kind) {
  case EMPTY:
    pcVar3 = "()";
    break;
  default:
    if (this->padding == 0xabababababababab) {
      pcVar3 = "probable heap corruption detected!";
      line = 0x78;
    }
    else {
      pcVar3 = "unknown s-expression!";
      line = 0x7b;
    }
    PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
              ,line,"DumpAtom",pcVar3);
  case SYMBOL:
    psVar1 = SymbolInterner::GetSymbol_abi_cxx11_((this->field_1).symbol_value);
    std::operator<<(stream,(string *)psVar1);
    return;
  case STRING:
    poVar2 = std::operator<<(stream,"\"");
    stream = std::operator<<(poVar2,(this->field_1).string_value);
    pcVar3 = "\"";
    break;
  case FIXNUM:
    std::ostream::_M_insert<double>((this->field_1).fixnum_value);
    return;
  case BOOL:
    if ((this->field_1).bool_value == true) {
      pcVar3 = "#t";
    }
    else {
      pcVar3 = "#f";
    }
    break;
  case END_OF_FILE:
    pcVar3 = "#eof";
    break;
  case ACTIVATION:
    pcVar3 = "#<activation>";
    break;
  case FUNCTION:
    pcVar3 = "#<function>";
    break;
  case NATIVE_FUNCTION:
    pcVar3 = "#<native function>";
    break;
  case MEANING:
    (*(code *)(((this->field_1).activation)->parent->field_1).symbol_value)
              ((this->field_1).activation,stream);
    return;
  }
  std::operator<<(stream,pcVar3);
  return;
}

Assistant:

void Sexp::DumpAtom(std::ostream &stream) const {
  if (IsString()) {
    stream << "\"" << this->string_value << "\"";
    return;
  }

  if (IsSymbol()) {
    stream << SymbolInterner::GetSymbol(this->symbol_value);
    return;
  }

  if (IsFixnum()) {
    stream << this->fixnum_value;
    return;
  }

  if (IsBool()) {
    if (this->bool_value) {
      stream << "#t";
    } else {
      stream << "#f";
    }

    return;
  }

  if (IsEof()) {
    stream << "#eof";
    return;
  }

  if (IsEmpty()) {
    stream << "()";
    return;
  }

  if (IsActivation()) {
    stream << "#<activation>";
    return;
  }

  if (IsFunction()) {
    stream << "#<function>";
    return;
  }

  if (IsNativeFunction()) {
    stream << "#<native function>";
    return;
  }

  if (IsMeaning()) {
    this->meaning->Dump(stream);
    return;
  }

  if (padding == 0xabababababababab) {
    PANIC("probable heap corruption detected!");
  }

  PANIC("unknown s-expression!");
}